

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int UnixFile_Open(char *zPath,int iOpenMode,jx9_value *pResource,void **ppHandle)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  if ((iOpenMode & 8U) == 0) {
    uVar1 = 0xc0;
    if ((iOpenMode & 0x40U) == 0) {
      uVar1 = (iOpenMode << 0x1b) >> 0x1f & 0x202;
    }
  }
  else {
    uVar1 = (iOpenMode & 0x10U) << 5 | 0x40;
  }
  uVar2 = 2;
  if ((iOpenMode & 4U) == 0) {
    uVar2 = (uint)iOpenMode >> 1 & 1;
  }
  iVar3 = 0;
  uVar1 = open(zPath,(iOpenMode & 0x20U) << 5 | uVar2 | uVar1,0x1a0);
  if ((int)uVar1 < 0) {
    iVar3 = -1;
  }
  else {
    *ppHandle = (void *)(ulong)uVar1;
  }
  return iVar3;
}

Assistant:

static int UnixFile_Open(const char *zPath, int iOpenMode, jx9_value *pResource, void **ppHandle)
{
	int iOpen = O_RDONLY;
	int fd;
	/* Set the desired flags according to the open mode */
	if( iOpenMode & JX9_IO_OPEN_CREATE ){
		/* Open existing file, or create if it doesn't exist */
		iOpen = O_CREAT;
		if( iOpenMode & JX9_IO_OPEN_TRUNC ){
			/* If the specified file exists and is writable, the function overwrites the file */
			iOpen |= O_TRUNC;
			SXUNUSED(pResource); /* cc warning */
		}
	}else if( iOpenMode & JX9_IO_OPEN_EXCL ){
		/* Creates a new file, only if it does not already exist.
		* If the file exists, it fails.
		*/
		iOpen = O_CREAT|O_EXCL;
	}else if( iOpenMode & JX9_IO_OPEN_TRUNC ){
		/* Opens a file and truncates it so that its size is zero bytes
		 * The file must exist.
		 */
		iOpen = O_RDWR|O_TRUNC;
	}
	if( iOpenMode & JX9_IO_OPEN_RDWR ){
		/* Read+Write access */
		iOpen &= ~O_RDONLY;
		iOpen |= O_RDWR;
	}else if( iOpenMode & JX9_IO_OPEN_WRONLY ){
		/* Write only access */
		iOpen &= ~O_RDONLY;
		iOpen |= O_WRONLY;
	}
	if( iOpenMode & JX9_IO_OPEN_APPEND ){
		/* Append mode */
		iOpen |= O_APPEND;
	}
#ifdef O_TEMP
	if( iOpenMode & JX9_IO_OPEN_TEMP ){
		/* File is temporary */
		iOpen |= O_TEMP;
	}
#endif
	/* Open the file now */
	fd = open(zPath, iOpen, JX9_UNIX_OPEN_MODE);
	if( fd < 0 ){
		/* IO error */
		return -1;
	}
	/* Save the handle */
	*ppHandle = SX_INT_TO_PTR(fd);
	return JX9_OK;
}